

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O2

bool __thiscall leveldb::Version::RecordReadSample(Version *this,Slice internal_key)

{
  bool bVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  Slice user_key;
  State state;
  GetStats local_30;
  int local_20;
  long local_18;
  
  uVar2 = internal_key.size_;
  user_key.data_ = internal_key.data_;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((7 < uVar2) && ((user_key.data_[uVar2 - 8] & 0xfeU) == 0)) {
    local_20 = 0;
    user_key.size_ = uVar2 - 8;
    ForEachOverlapping(this,user_key,internal_key,&local_30,
                       RecordReadSample(leveldb::Slice)::State::Match(void*,int,leveldb::
                       FileMetaData__);
    if (1 < local_20) {
      bVar1 = UpdateStats(this,&local_30);
      goto LAB_00a4c8be;
    }
  }
  bVar1 = false;
LAB_00a4c8be:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool Version::RecordReadSample(Slice internal_key) {
  ParsedInternalKey ikey;
  if (!ParseInternalKey(internal_key, &ikey)) {
    return false;
  }

  struct State {
    GetStats stats;  // Holds first matching file
    int matches;

    static bool Match(void* arg, int level, FileMetaData* f) {
      State* state = reinterpret_cast<State*>(arg);
      state->matches++;
      if (state->matches == 1) {
        // Remember first match.
        state->stats.seek_file = f;
        state->stats.seek_file_level = level;
      }
      // We can stop iterating once we have a second match.
      return state->matches < 2;
    }
  };

  State state;
  state.matches = 0;
  ForEachOverlapping(ikey.user_key, internal_key, &state, &State::Match);

  // Must have at least two matches since we want to merge across
  // files. But what if we have a single file that contains many
  // overwrites and deletions?  Should we have another mechanism for
  // finding such files?
  if (state.matches >= 2) {
    // 1MB cost is about 1 seek (see comment in Builder::Apply).
    return UpdateStats(state.stats);
  }
  return false;
}